

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_monster_spell_freq(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"freq");
    if ((uint)(wVar1 + L'\xffffff9b') < 0xffffff9c) {
      pVar2 = PARSE_ERROR_INVALID_SPELL_FREQ;
    }
    else {
      *(uint *)((long)pvVar3 + 0x54) = (uint)(byte)(100 / (byte)wVar1);
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_monster_spell_freq(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	int pct;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	pct = parser_getint(p, "freq");
	if (pct < 1 || pct > 100)
		return PARSE_ERROR_INVALID_SPELL_FREQ;
	r->freq_spell = 100 / pct;
	return PARSE_ERROR_NONE;
}